

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * template_usetemplate(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_symbol *ptVar2;
  t_template *ptVar3;
  t_template *x2;
  t_atom *argv_00;
  int argc_00;
  
  ptVar2 = atom_getsymbolarg(0,argc,argv);
  ptVar2 = canvas_makebindsym(ptVar2);
  if (argc != 0) {
    argc_00 = argc + -1;
    argv_00 = argv + 1;
    ptVar3 = (t_template *)pd_findbyclass(ptVar2,template_class);
    if (ptVar3 == (t_template *)0x0) {
      template_new(ptVar2,argc_00,argv_00);
    }
    else {
      x2 = template_new(&s_,argc_00,argv_00);
      iVar1 = template_match(ptVar3,x2);
      if (iVar1 == 0) {
        if (ptVar3->t_list == (_gtemplate *)0x0) {
          template_conform(ptVar3,x2);
          pd_free((t_pd *)ptVar3);
          ptVar3 = template_new(ptVar2,argc_00,argv_00);
          ptVar3->t_list = (_gtemplate *)0x0;
        }
        else {
          pd_error((void *)0x0,"%s: template mismatch",ptVar2->s_name);
        }
      }
      pd_free(&x2->t_pdobj);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *template_usetemplate(void *dummy, t_symbol *s,
    int argc, t_atom *argv)
{
    t_template *x;
    t_symbol *templatesym =
        canvas_makebindsym(atom_getsymbolarg(0, argc, argv));
    if (!argc)
        return (0);
    argc--; argv++;
            /* check if there's already a template by this name. */
    if ((x = (t_template *)pd_findbyclass(templatesym, template_class)))
    {
        t_template *y = template_new(&s_, argc, argv), *y2;
            /* If the new template is the same as the old one,
            there's nothing to do.  */
        if (!template_match(x, y))
        {
                /* Are there "struct" objects upholding this template? */
            if (x->t_list)
            {
                    /* don't know what to do here! */
                pd_error(0, "%s: template mismatch",
                    templatesym->s_name);
            }
            else
            {
                    /* conform everyone to the new template */
                template_conform(x, y);
                pd_free(&x->t_pdobj);
                y2 = template_new(templatesym, argc, argv);
                y2->t_list = 0;
            }
        }
        pd_free(&y->t_pdobj);
    }
        /* otherwise, just make one. */
    else template_new(templatesym, argc, argv);
    return (0);
}